

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_date_tests.cpp
# Opt level: O2

void __thiscall DateTests_canCreateDates_Test::TestBody(DateTests_canCreateDates_Test *this)

{
  bool bVar1;
  Date *pDVar2;
  AssertionResult *this_00;
  char *pcVar3;
  char *in_R9;
  int32_t *this_01;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar4;
  AssertHelper AStack_3d8;
  Date date7;
  Date date6;
  Date date5;
  Date date4;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__6;
  Date date8;
  Date date3;
  AssertionResult gtest_ar__7;
  Date date9;
  Date date11;
  Date date12;
  Date date2;
  Date date10;
  Date date1;
  
  date2.m_day = 0x7e1;
  date3.m_day = 4;
  date4.m_day = 0xc;
  database::Date::Date(&date1,&date2.m_day,&date3.m_day,&date4.m_day);
  date3.m_day = date1.m_day;
  date4.m_day = 0xc;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&date2,"date1.day()","12",&date3.m_day,&date4.m_day);
  if ((char)date2.m_day == '\0') {
    testing::Message::Message((Message *)&date3);
    if ((undefined8 *)CONCAT44(date2.m_serialized_value,date2.m_year) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(date2.m_serialized_value,date2.m_year);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&date4,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
               ,8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&date4,(Message *)&date3);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&date2.m_year);
    date3.m_day = date1.m_month;
    date4.m_day = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&date2,"date1.month()","04",&date3.m_day,&date4.m_day);
    if ((char)date2.m_day == '\0') {
      testing::Message::Message((Message *)&date3);
      if ((undefined8 *)CONCAT44(date2.m_serialized_value,date2.m_year) == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(date2.m_serialized_value,date2.m_year);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&date4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                 ,9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&date4,(Message *)&date3);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&date2.m_year);
      date3.m_day = date1.m_year;
      date4.m_day = 0x7e1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&date2,"date1.year()","2017",&date3.m_day,&date4.m_day);
      if ((char)date2.m_day == '\0') {
        testing::Message::Message((Message *)&date3);
        if ((undefined8 *)CONCAT44(date2.m_serialized_value,date2.m_year) == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT44(date2.m_serialized_value,date2.m_year);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&date4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                   ,10,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&date4,(Message *)&date3);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&date2.m_year);
        date3.m_day = date1.m_serialized_value;
        date4.m_day = 0x133c6ac;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&date2,"date1.serialized_value()","20170412",&date3.m_day,
                   &date4.m_day);
        if ((char)date2.m_day != '\0') {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&date2.m_year);
          date3.m_day = 0x131a6e2;
          database::Date::With_yyyymmdd(&date2,&date3.m_day);
          date4.m_day = date2.m_day;
          date5.m_day = 2;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&date3,"date2.day()","02",&date4.m_day,&date5.m_day);
          if ((char)date3.m_day == '\0') {
            testing::Message::Message((Message *)&date4);
            if ((undefined8 *)CONCAT44(date3.m_serialized_value,date3.m_year) == (undefined8 *)0x0)
            {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)CONCAT44(date3.m_serialized_value,date3.m_year);
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&date5,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                       ,0xe,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&date5,(Message *)&date4);
LAB_0010a3b2:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date4);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date3.m_year);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date3.m_year);
            date4.m_day = date2.m_month;
            date5.m_day = 0xc;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&date3,"date2.month()","12",&date4.m_day,&date5.m_day);
            if ((char)date3.m_day == '\0') {
              testing::Message::Message((Message *)&date4);
              if ((undefined8 *)CONCAT44(date3.m_serialized_value,date3.m_year) == (undefined8 *)0x0
                 ) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)CONCAT44(date3.m_serialized_value,date3.m_year);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&date5,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0xf,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&date5,(Message *)&date4);
              goto LAB_0010a3b2;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date3.m_year);
            date4.m_day = date2.m_year;
            date5.m_day = 0x7d3;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&date3,"date2.year()","2003",&date4.m_day,&date5.m_day);
            if ((char)date3.m_day == '\0') {
              testing::Message::Message((Message *)&date4);
              if ((undefined8 *)CONCAT44(date3.m_serialized_value,date3.m_year) == (undefined8 *)0x0
                 ) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)CONCAT44(date3.m_serialized_value,date3.m_year);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&date5,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0x10,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&date5,(Message *)&date4);
              goto LAB_0010a3b2;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date3.m_year);
            date4.m_day = date2.m_serialized_value;
            date5.m_day = 0x131a6e2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&date3,"date2.serialized_value()","20031202",&date4.m_day,
                       &date5.m_day);
            if ((char)date3.m_day == '\0') {
              testing::Message::Message((Message *)&date4);
              if ((undefined8 *)CONCAT44(date3.m_serialized_value,date3.m_year) == (undefined8 *)0x0
                 ) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)CONCAT44(date3.m_serialized_value,date3.m_year);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&date5,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0x11,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&date5,(Message *)&date4);
              goto LAB_0010a3b2;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&date3.m_year);
            date4.m_day = 10;
            date5.m_day = 5;
            date6.m_day = 0x7ce;
            database::Date::Date(&date3,&date6.m_day,&date4.m_day,&date5.m_day);
            date5.m_day = date3.m_day;
            date6.m_day = 5;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&date4,"date3.day()","05",&date5.m_day,&date6.m_day);
            if ((char)date4.m_day == '\0') {
              testing::Message::Message((Message *)&date5);
              if ((undefined8 *)CONCAT44(date4.m_serialized_value,date4.m_year) == (undefined8 *)0x0
                 ) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)CONCAT44(date4.m_serialized_value,date4.m_year);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&date6,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                         ,0x14,pcVar3);
              testing::internal::AssertHelper::operator=((AssertHelper *)&date6,(Message *)&date5);
LAB_0010a53a:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date6);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date5);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date4.m_year);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date4.m_year);
              date5.m_day = date3.m_month;
              date6.m_day = 10;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&date4,"date3.month()","10",&date5.m_day,&date6.m_day);
              if ((char)date4.m_day == '\0') {
                testing::Message::Message((Message *)&date5);
                if ((undefined8 *)CONCAT44(date4.m_serialized_value,date4.m_year) ==
                    (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)CONCAT44(date4.m_serialized_value,date4.m_year);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&date6,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x15,pcVar3);
                testing::internal::AssertHelper::operator=((AssertHelper *)&date6,(Message *)&date5)
                ;
                goto LAB_0010a53a;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date4.m_year);
              date5.m_day = date3.m_year;
              date6.m_day = 0x7ce;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&date4,"date3.year()","1998",&date5.m_day,&date6.m_day);
              if ((char)date4.m_day == '\0') {
                testing::Message::Message((Message *)&date5);
                if ((undefined8 *)CONCAT44(date4.m_serialized_value,date4.m_year) ==
                    (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)CONCAT44(date4.m_serialized_value,date4.m_year);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&date6,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x16,pcVar3);
                testing::internal::AssertHelper::operator=((AssertHelper *)&date6,(Message *)&date5)
                ;
                goto LAB_0010a53a;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date4.m_year);
              date5.m_day = date3.m_serialized_value;
              date6.m_day = 0x130e2cd;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&date4,"date3.serialized_value()","19981005",&date5.m_day,
                         &date6.m_day);
              if ((char)date4.m_day == '\0') {
                testing::Message::Message((Message *)&date5);
                if ((undefined8 *)CONCAT44(date4.m_serialized_value,date4.m_year) ==
                    (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)CONCAT44(date4.m_serialized_value,date4.m_year);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&date6,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x17,pcVar3);
                testing::internal::AssertHelper::operator=((AssertHelper *)&date6,(Message *)&date5)
                ;
                goto LAB_0010a53a;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&date4.m_year);
              date5.m_day = 0x6f1d42;
              database::Date::With_mmddyyyy(&date4,&date5.m_day);
              date6.m_day = date4.m_day;
              date7.m_day = 0x1c;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&date5,"date4.day()","28",&date6.m_day,&date7.m_day);
              if ((char)date5.m_day == '\0') {
                testing::Message::Message((Message *)&date6);
                if ((undefined8 *)CONCAT44(date5.m_serialized_value,date5.m_year) ==
                    (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)CONCAT44(date5.m_serialized_value,date5.m_year);
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&date7,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                           ,0x1a,pcVar3);
                testing::internal::AssertHelper::operator=((AssertHelper *)&date7,(Message *)&date6)
                ;
LAB_0010a6a7:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date7);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date6);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date5.m_year);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date5.m_year);
                date6.m_day = date4.m_month;
                date7.m_day = 7;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&date5,"date4.month()","7",&date6.m_day,&date7.m_day);
                if ((char)date5.m_day == '\0') {
                  testing::Message::Message((Message *)&date6);
                  if ((undefined8 *)CONCAT44(date5.m_serialized_value,date5.m_year) ==
                      (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)CONCAT44(date5.m_serialized_value,date5.m_year);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&date7,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x1b,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&date7,(Message *)&date6);
                  goto LAB_0010a6a7;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date5.m_year);
                date6.m_day = date4.m_year;
                date7.m_day = 0x7c2;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&date5,"date4.year()","1986",&date6.m_day,&date7.m_day);
                if ((char)date5.m_day == '\0') {
                  testing::Message::Message((Message *)&date6);
                  if ((undefined8 *)CONCAT44(date5.m_serialized_value,date5.m_year) ==
                      (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)CONCAT44(date5.m_serialized_value,date5.m_year);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&date7,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x1c,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&date7,(Message *)&date6);
                  goto LAB_0010a6a7;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date5.m_year);
                date6.m_day = date4.m_serialized_value;
                date7.m_day = 0x12f0cf8;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&date5,"date4.serialized_value()","19860728",&date6.m_day,
                           &date7.m_day);
                if ((char)date5.m_day == '\0') {
                  testing::Message::Message((Message *)&date6);
                  if ((undefined8 *)CONCAT44(date5.m_serialized_value,date5.m_year) ==
                      (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)CONCAT44(date5.m_serialized_value,date5.m_year);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&date7,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x1d,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&date7,(Message *)&date6);
                  goto LAB_0010a6a7;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&date5.m_year);
                date6.m_day = 1;
                date7.m_day = 0xb;
                date8.m_day = 0x7d1;
                database::Date::Date(&date5,&date8.m_day,&date7.m_day,&date6.m_day);
                date7.m_day = date5.m_day;
                date8.m_day = 1;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&date6,"date5.day()","1",&date7.m_day,&date8.m_day);
                if ((char)date6.m_day == '\0') {
                  testing::Message::Message((Message *)&date7);
                  if ((undefined8 *)CONCAT44(date6.m_serialized_value,date6.m_year) ==
                      (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)CONCAT44(date6.m_serialized_value,date6.m_year);
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&date8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                             ,0x20,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&date8,(Message *)&date7);
LAB_0010a823:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date8);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date7);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date6.m_year);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date6.m_year);
                  date7.m_day = date5.m_month;
                  date8.m_day = 0xb;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&date6,"date5.month()","11",&date7.m_day,&date8.m_day);
                  if ((char)date6.m_day == '\0') {
                    testing::Message::Message((Message *)&date7);
                    if ((undefined8 *)CONCAT44(date6.m_serialized_value,date6.m_year) ==
                        (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)CONCAT44(date6.m_serialized_value,date6.m_year);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&date8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x21,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&date8,(Message *)&date7);
                    goto LAB_0010a823;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date6.m_year);
                  date7.m_day = date5.m_year;
                  date8.m_day = 0x7d1;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&date6,"date5.year()","2001",&date7.m_day,&date8.m_day);
                  if ((char)date6.m_day == '\0') {
                    testing::Message::Message((Message *)&date7);
                    if ((undefined8 *)CONCAT44(date6.m_serialized_value,date6.m_year) ==
                        (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)CONCAT44(date6.m_serialized_value,date6.m_year);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&date8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x22,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&date8,(Message *)&date7);
                    goto LAB_0010a823;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date6.m_year);
                  date7.m_day = date5.m_serialized_value;
                  date8.m_day = 0x131585d;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&date6,"date5.serialized_value()","20011101",&date7.m_day,
                             &date8.m_day);
                  if ((char)date6.m_day == '\0') {
                    testing::Message::Message((Message *)&date7);
                    if ((undefined8 *)CONCAT44(date6.m_serialized_value,date6.m_year) ==
                        (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)CONCAT44(date6.m_serialized_value,date6.m_year);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&date8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x23,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&date8,(Message *)&date7);
                    goto LAB_0010a823;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&date6.m_year);
                  date7.m_day = 0x12240be;
                  database::Date::With_ddmmyyyy(&date6,&date7.m_day);
                  date8.m_day = date6.m_day;
                  date9.m_day = 0x13;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&date7,"date6.day()","19",&date8.m_day,&date9.m_day);
                  if ((char)date7.m_day == '\0') {
                    testing::Message::Message((Message *)&date8);
                    if ((undefined8 *)CONCAT44(date7.m_serialized_value,date7.m_year) ==
                        (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)CONCAT44(date7.m_serialized_value,date7.m_year);
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&date9,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                               ,0x26,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&date9,(Message *)&date8);
LAB_0010aa62:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date9);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date8);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date7.m_year);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date7.m_year);
                    date8.m_day = date6.m_month;
                    date9.m_day = 2;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&date7,"date6.month()","02",&date8.m_day,&date9.m_day);
                    if ((char)date7.m_day == '\0') {
                      testing::Message::Message((Message *)&date8);
                      if ((undefined8 *)CONCAT44(date7.m_serialized_value,date7.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = *(char **)CONCAT44(date7.m_serialized_value,date7.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&date9,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x27,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&date9,(Message *)&date8);
                      goto LAB_0010aa62;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date7.m_year);
                    date8.m_day = date6.m_year;
                    date9.m_day = 0x7de;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&date7,"date6.year()","2014",&date8.m_day,&date9.m_day);
                    if ((char)date7.m_day == '\0') {
                      testing::Message::Message((Message *)&date8);
                      if ((undefined8 *)CONCAT44(date7.m_serialized_value,date7.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = *(char **)CONCAT44(date7.m_serialized_value,date7.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&date9,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x28,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&date9,(Message *)&date8);
                      goto LAB_0010aa62;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date7.m_year);
                    date8.m_day = date6.m_serialized_value;
                    date9.m_day = 0x13350bb;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&date7,"date6.serialized_value()","20140219",&date8.m_day
                               ,&date9.m_day);
                    if ((char)date7.m_day == '\0') {
                      testing::Message::Message((Message *)&date8);
                      if ((undefined8 *)CONCAT44(date7.m_serialized_value,date7.m_year) ==
                          (undefined8 *)0x0) {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = *(char **)CONCAT44(date7.m_serialized_value,date7.m_year);
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&date9,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x29,pcVar3);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&date9,(Message *)&date8);
                      goto LAB_0010aa62;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&date7.m_year);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&date9,"20031202",(allocator<char> *)&date10);
                    std::__cxx11::string::string((string *)&date8,(string *)&date9);
                    database::Date::With_yyyymmdd(&date7,(ComparableString *)&date8);
                    std::__cxx11::string::~string((string *)&date8);
                    std::__cxx11::string::~string((string *)&date9);
                    date9.m_day = 0x7d3;
                    date10.m_day = 0xc;
                    date11.m_day = 2;
                    database::Date::Date(&date8,&date9.m_day,&date10.m_day,&date11.m_day);
                    if ((date7.m_year == date8.m_year) && (date7.m_month == date8.m_month)) {
                      date10.m_year = 0;
                      date10.m_serialized_value = 0;
                      date10.m_day = CONCAT31(date10.m_day._1_3_,date7.m_day == date8.m_day);
                      if (date7.m_day != date8.m_day) goto LAB_0010a976;
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&date10.m_year);
                      database::Date::string_value((ComparableString *)&date9,&date7);
                      database::Date::string_value((ComparableString *)&date10,&date8);
                      bVar1 = database::ComparableString::operator==
                                        ((ComparableString *)&date9,(ComparableString *)&date10);
                      this_01 = &date11.m_year;
                      date11.m_day = CONCAT31(date11.m_day._1_3_,bVar1);
                      date11.m_year = 0;
                      date11.m_serialized_value = 0;
                      std::__cxx11::string::~string((string *)&date10);
                      std::__cxx11::string::~string((string *)&date9);
                      if ((char)date11.m_day == '\0') {
                        testing::Message::Message((Message *)&date10);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&date9,(internal *)&date11,
                                   (AssertionResult *)"date7.string_value() == date8.string_value()"
                                   ,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&date12,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x2e,(char *)CONCAT44(date9.m_month,date9.m_day));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&date12,(Message *)&date10);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date12);
                        std::__cxx11::string::~string((string *)&date9);
                        pDVar2 = &date10;
                        goto LAB_0010aa06;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)this_01);
                      date10.m_year = 0;
                      date10.m_serialized_value = 0;
                      date10.m_day = CONCAT31(date10.m_day._1_3_,
                                              date7.m_serialized_value == date8.m_serialized_value);
                      if (date7.m_serialized_value != date8.m_serialized_value) {
                        testing::Message::Message((Message *)&date11);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&date9,(internal *)&date10,
                                   (AssertionResult *)
                                   "date7.serialized_value() == date8.serialized_value()","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&date12,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x2f,(char *)CONCAT44(date9.m_month,date9.m_day));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&date12,(Message *)&date11);
                        goto LAB_0010a9e4;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&date10.m_year);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&date11,"7281986",(allocator<char> *)&date12);
                      std::__cxx11::string::string((string *)&date10,(string *)&date11);
                      database::Date::With_mmddyyyy(&date9,(ComparableString *)&date10);
                      std::__cxx11::string::~string((string *)&date10);
                      std::__cxx11::string::~string((string *)&date11);
                      date11.m_day = 7;
                      date12.m_day = 0x1c;
                      gtest_ar__4.success_ = true;
                      gtest_ar__4._1_3_ = 7;
                      database::Date::Date
                                (&date10,(int32_t *)&gtest_ar__4,&date11.m_day,&date12.m_day);
                      if ((date9.m_year == date10.m_year) && (date9.m_month == date10.m_month)) {
                        date12.m_year = 0;
                        date12.m_serialized_value = 0;
                        date12.m_day = CONCAT31(date12.m_day._1_3_,date9.m_day == date10.m_day);
                        if (date9.m_day != date10.m_day) goto LAB_0010abb1;
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&date12.m_year);
                        database::Date::string_value((ComparableString *)&date11,&date9);
                        database::Date::string_value((ComparableString *)&date12,&date10);
                        bVar1 = database::ComparableString::operator==
                                          ((ComparableString *)&date11,(ComparableString *)&date12);
                        psVar4 = &gtest_ar__4.message_;
                        gtest_ar__4.success_ = bVar1;
                        gtest_ar__4.message_.ptr_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                        std::__cxx11::string::~string((string *)&date12);
                        std::__cxx11::string::~string((string *)&date11);
                        if (gtest_ar__4.success_ == false) {
                          testing::Message::Message((Message *)&date12);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&date11,(internal *)&gtest_ar__4,
                                     (AssertionResult *)
                                     "date9.string_value() == date10.string_value()","false","true",
                                     in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x34,(char *)CONCAT44(date11.m_month,date11.m_day));
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__6,(Message *)&date12);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__6);
                          std::__cxx11::string::~string((string *)&date11);
                          pDVar2 = &date12;
                          goto LAB_0010ac41;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(psVar4);
                        date12.m_year = 0;
                        date12.m_serialized_value = 0;
                        date12.m_day = CONCAT31(date12.m_day._1_3_,
                                                date9.m_serialized_value ==
                                                date10.m_serialized_value);
                        if (date9.m_serialized_value != date10.m_serialized_value) {
                          testing::Message::Message((Message *)&gtest_ar__4);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&date11,(internal *)&date12,
                                     (AssertionResult *)
                                     "date9.serialized_value() == date10.serialized_value()","false"
                                     ,"true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x35,(char *)CONCAT44(date11.m_month,date11.m_day));
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__6,(Message *)&gtest_ar__4);
                          goto LAB_0010ac1f;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&date12.m_year);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&gtest_ar__4,"19022014",(allocator<char> *)&gtest_ar__6
                                  );
                        std::__cxx11::string::string((string *)&date12,(string *)&gtest_ar__4);
                        database::Date::With_ddmmyyyy(&date11,(ComparableString *)&date12);
                        std::__cxx11::string::~string((string *)&date12);
                        std::__cxx11::string::~string((string *)&gtest_ar__4);
                        gtest_ar__4.success_ = true;
                        gtest_ar__4._1_3_ = 0;
                        gtest_ar__6.success_ = true;
                        gtest_ar__6._1_3_ = 0;
                        gtest_ar__7.success_ = true;
                        gtest_ar__7._1_3_ = 7;
                        database::Date::Date
                                  (&date12,(int32_t *)&gtest_ar__7,(int32_t *)&gtest_ar__6,
                                   (int32_t *)&gtest_ar__4);
                        if ((date11.m_year == date12.m_year) && (date11.m_month == date12.m_month))
                        {
                          gtest_ar__6.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          gtest_ar__6.success_ = date11.m_day == date12.m_day;
                          if (date11.m_day != date12.m_day) goto LAB_0010ad86;
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar__6.message_);
                          database::Date::string_value((ComparableString *)&gtest_ar__4,&date11);
                          database::Date::string_value((ComparableString *)&gtest_ar__6,&date12);
                          bVar1 = database::ComparableString::operator==
                                            ((ComparableString *)&gtest_ar__4,
                                             (ComparableString *)&gtest_ar__6);
                          psVar4 = &gtest_ar__7.message_;
                          gtest_ar__7.success_ = bVar1;
                          gtest_ar__7.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          std::__cxx11::string::~string((string *)&gtest_ar__6);
                          std::__cxx11::string::~string((string *)&gtest_ar__4);
                          if (gtest_ar__7.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar__6);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__4,(internal *)&gtest_ar__7,
                                       (AssertionResult *)
                                       "date11.string_value() == date12.string_value()","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&AStack_3d8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                       ,0x3a,(char *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_));
                            testing::internal::AssertHelper::operator=
                                      (&AStack_3d8,(Message *)&gtest_ar__6);
                            testing::internal::AssertHelper::~AssertHelper(&AStack_3d8);
                            std::__cxx11::string::~string((string *)&gtest_ar__4);
                            this_00 = &gtest_ar__6;
                            goto LAB_0010ae07;
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(psVar4);
                          psVar4 = &gtest_ar__6.message_;
                          gtest_ar__6.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          gtest_ar__6.success_ =
                               date11.m_serialized_value == date12.m_serialized_value;
                          if (date11.m_serialized_value != date12.m_serialized_value) {
                            testing::Message::Message((Message *)&gtest_ar__7);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
                                       (AssertionResult *)
                                       "date11.serialized_value() == date12.serialized_value()",
                                       "false","true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&AStack_3d8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                       ,0x3b,(char *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_));
                            testing::internal::AssertHelper::operator=
                                      (&AStack_3d8,(Message *)&gtest_ar__7);
                            goto LAB_0010adea;
                          }
                        }
                        else {
                          gtest_ar__6._0_4_ = (uint)(uint3)gtest_ar__6._1_3_ << 8;
LAB_0010ad86:
                          gtest_ar__6.message_.ptr_ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                          testing::Message::Message((Message *)&gtest_ar__7);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__4,(internal *)&gtest_ar__6,
                                     (AssertionResult *)"date11 == date12","false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&AStack_3d8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                     ,0x39,(char *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_));
                          testing::internal::AssertHelper::operator=
                                    (&AStack_3d8,(Message *)&gtest_ar__7);
LAB_0010adea:
                          psVar4 = &gtest_ar__6.message_;
                          testing::internal::AssertHelper::~AssertHelper(&AStack_3d8);
                          std::__cxx11::string::~string((string *)&gtest_ar__4);
                          this_00 = &gtest_ar__7;
LAB_0010ae07:
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)this_00);
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(psVar4);
                        std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::~_Hashtable(&date12.m_days_of_months._M_h);
                        std::
                        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::~_Hashtable(&date11.m_days_of_months._M_h);
                      }
                      else {
                        date12.m_day = (uint)date12.m_day._1_3_ << 8;
LAB_0010abb1:
                        date12.m_year = 0;
                        date12.m_serialized_value = 0;
                        testing::Message::Message((Message *)&gtest_ar__4);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&date11,(internal *)&date12,
                                   (AssertionResult *)"date9 == date10","false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__6,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                   ,0x33,(char *)CONCAT44(date11.m_month,date11.m_day));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__6,(Message *)&gtest_ar__4);
LAB_0010ac1f:
                        psVar4 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&date12.m_year;
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6)
                        ;
                        std::__cxx11::string::~string((string *)&date11);
                        pDVar2 = (Date *)&gtest_ar__4;
LAB_0010ac41:
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)pDVar2);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(psVar4);
                      }
                      std::
                      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::~_Hashtable(&date10.m_days_of_months._M_h);
                      std::
                      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::~_Hashtable(&date9.m_days_of_months._M_h);
                    }
                    else {
                      date10.m_day = (uint)date10.m_day._1_3_ << 8;
LAB_0010a976:
                      date10.m_year = 0;
                      date10.m_serialized_value = 0;
                      testing::Message::Message((Message *)&date11);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&date9,(internal *)&date10,
                                 (AssertionResult *)"date7 == date8","false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&date12,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                                 ,0x2d,(char *)CONCAT44(date9.m_month,date9.m_day));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&date12,(Message *)&date11);
LAB_0010a9e4:
                      this_01 = &date10.m_year;
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date12);
                      std::__cxx11::string::~string((string *)&date9);
                      pDVar2 = &date11;
LAB_0010aa06:
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)pDVar2);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)this_01);
                    }
                    std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::~_Hashtable(&date8.m_days_of_months._M_h);
                    std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::~_Hashtable(&date7.m_days_of_months._M_h);
                  }
                  std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&date6.m_days_of_months._M_h);
                }
                std::
                _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::~_Hashtable(&date5.m_days_of_months._M_h);
              }
              std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable(&date4.m_days_of_months._M_h);
            }
            std::
            _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&date3.m_days_of_months._M_h);
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&date2.m_days_of_months._M_h);
          goto LAB_0010a230;
        }
        testing::Message::Message((Message *)&date3);
        if ((undefined8 *)CONCAT44(date2.m_serialized_value,date2.m_year) == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT44(date2.m_serialized_value,date2.m_year);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&date4,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_date_tests.cpp"
                   ,0xb,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&date4,(Message *)&date3);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&date4);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&date3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&date2.m_year);
LAB_0010a230:
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&date1.m_days_of_months._M_h);
  return;
}

Assistant:

TEST(DateTests,canCreateDates)
{
  database::Date date1 = database::Date::With_yyyy_mm_dd(2017,04,12);
  ASSERT_EQ(date1.day(),12);
  ASSERT_EQ(date1.month(),04);
  ASSERT_EQ(date1.year(),2017);
  ASSERT_EQ(date1.serialized_value(),20170412);

  database::Date date2 = database::Date::With_yyyymmdd(20031202);
  ASSERT_EQ(date2.day(),02);
  ASSERT_EQ(date2.month(),12);
  ASSERT_EQ(date2.year(),2003);
  ASSERT_EQ(date2.serialized_value(),20031202);

  database::Date date3 = database::Date::With_mm_dd_yyyy(10,05,1998);
  ASSERT_EQ(date3.day(),05);
  ASSERT_EQ(date3.month(),10);
  ASSERT_EQ(date3.year(),1998);
  ASSERT_EQ(date3.serialized_value(),19981005);

  database::Date date4 = database::Date::With_mmddyyyy(7281986);
  ASSERT_EQ(date4.day(),28);
  ASSERT_EQ(date4.month(),7);
  ASSERT_EQ(date4.year(),1986);
  ASSERT_EQ(date4.serialized_value(),19860728);

  database::Date date5 = database::Date::With_dd_mm_yyyy(1,11,2001);
  ASSERT_EQ(date5.day(),1);
  ASSERT_EQ(date5.month(),11);
  ASSERT_EQ(date5.year(),2001);
  ASSERT_EQ(date5.serialized_value(),20011101);

  database::Date date6 = database::Date::With_ddmmyyyy(19022014);
  ASSERT_EQ(date6.day(),19);
  ASSERT_EQ(date6.month(),02);
  ASSERT_EQ(date6.year(),2014);
  ASSERT_EQ(date6.serialized_value(),20140219);

  database::Date date7 = database::Date::With_yyyymmdd((std::string)"20031202");
  database::Date date8 = database::Date::With_yyyy_mm_dd(2003,12,02);
  ASSERT_TRUE(date7 == date8);
  ASSERT_TRUE(date7.string_value() == date8.string_value());
  ASSERT_TRUE(date7.serialized_value() == date8.serialized_value());

  database::Date date9 = database::Date::With_mmddyyyy((std::string)"7281986");
  database::Date date10 = database::Date::With_mm_dd_yyyy(07,28,1986);
  ASSERT_TRUE(date9 == date10);
  ASSERT_TRUE(date9.string_value() == date10.string_value());
  ASSERT_TRUE(date9.serialized_value() == date10.serialized_value());

  database::Date date11 = database::Date::With_ddmmyyyy((std::string)"19022014");
  database::Date date12 = database::Date::With_dd_mm_yyyy(19,02,2014);
  ASSERT_TRUE(date11 == date12);
  ASSERT_TRUE(date11.string_value() == date12.string_value());
  ASSERT_TRUE(date11.serialized_value() == date12.serialized_value());
}